

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O3

void Curl_cpool_prune_dead(Curl_easy *data)

{
  Curl_share *pCVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  _Bool _Var4;
  timediff_t tVar5;
  Curl_multi *pCVar6;
  cpool *cpool;
  curltime cVar7;
  curltime newer;
  curltime older;
  time_t local_40;
  int iStack_38;
  undefined4 uStack_34;
  
  if (data != (Curl_easy *)0x0) {
    pCVar1 = data->share;
    if ((pCVar1 == (Curl_share *)0x0) || ((pCVar1->specifier & 0x20) == 0)) {
      pCVar6 = data->multi_easy;
      if ((pCVar6 == (Curl_multi *)0x0) && (pCVar6 = data->multi, pCVar6 == (Curl_multi *)0x0)) {
        return;
      }
      cpool = &pCVar6->cpool;
    }
    else {
      cpool = &pCVar1->cpool;
    }
    cVar7 = Curl_now();
    local_40 = cVar7.tv_sec;
    iStack_38 = cVar7.tv_usec;
    if ((cpool->share != (Curl_share *)0x0) && ((cpool->share->specifier & 0x20) != 0)) {
      Curl_share_lock(data,CURL_LOCK_DATA_CONNECT,CURL_LOCK_ACCESS_SINGLE);
    }
    cpool->field_0x68 = cpool->field_0x68 | 1;
    uVar2 = (cpool->last_cleanup).tv_sec;
    uVar3 = (cpool->last_cleanup).tv_usec;
    older.tv_usec = uVar3;
    older.tv_sec = uVar2;
    newer._12_4_ = 0;
    newer.tv_sec = SUB128(cVar7._0_12_,0);
    newer.tv_usec = SUB124(cVar7._0_12_,8);
    older._12_4_ = 0;
    tVar5 = Curl_timediff(newer,older);
    if (999 < tVar5) {
      do {
        _Var4 = cpool_foreach(data,cpool,&local_40,cpool_reap_dead_cb);
      } while (_Var4);
      (cpool->last_cleanup).tv_sec = local_40;
      *(ulong *)&(cpool->last_cleanup).tv_usec = CONCAT44(uStack_34,iStack_38);
    }
    cpool->field_0x68 = cpool->field_0x68 & 0xfe;
    if ((cpool->share != (Curl_share *)0x0) && ((cpool->share->specifier & 0x20) != 0)) {
      Curl_share_unlock(data,CURL_LOCK_DATA_CONNECT);
    }
  }
  return;
}

Assistant:

void Curl_cpool_prune_dead(struct Curl_easy *data)
{
  struct cpool *cpool = cpool_get_instance(data);
  struct cpool_reaper_ctx rctx;
  timediff_t elapsed;

  if(!cpool)
    return;

  rctx.now = Curl_now();
  CPOOL_LOCK(cpool, data);
  elapsed = Curl_timediff(rctx.now, cpool->last_cleanup);

  if(elapsed >= 1000L) {
    while(cpool_foreach(data, cpool, &rctx, cpool_reap_dead_cb))
      ;
    cpool->last_cleanup = rctx.now;
  }
  CPOOL_UNLOCK(cpool, data);
}